

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O3

bool QMainWindowLayout::needsPlatformDrag(void)

{
  if (needsPlatformDrag()::wayland == '\0') {
    needsPlatformDrag();
  }
  return needsPlatformDrag::wayland;
}

Assistant:

bool QMainWindowLayout::needsPlatformDrag()
{
    static const bool wayland =
            QGuiApplication::platformName().startsWith("wayland"_L1, Qt::CaseInsensitive);
    return wayland;
}